

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

bool __thiscall YAML::Stream::operator_cast_to_bool(Stream *this)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) == 0) {
    return true;
  }
  pcVar2 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != pcVar2) {
    uVar1 = (long)pcVar2 -
            (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    if (0x1ff < uVar1) {
      uVar3 = uVar1 >> 9 | 0xff80000000000000;
      if (0 < (long)uVar1) {
        uVar3 = uVar1 >> 9;
      }
      pcVar2 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar3] + uVar1 + uVar3 * -0x200;
    }
    return *pcVar2 != '\x04';
  }
  return false;
}

Assistant:

Stream::operator bool() const {
  return m_input.good() ||
         (!m_readahead.empty() && m_readahead[0] != Stream::eof());
}